

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcode.cpp
# Opt level: O0

int jh_lex(void)

{
  size_t sVar1;
  char *pcVar2;
  char *forward;
  char *lexemeBegin;
  int type;
  
  lexemeBegin._0_4_ = -1;
  sVar1 = fread(jh_buffer,1,0x1001,(FILE *)jh_in);
  if (sVar1 == 0) {
    lexemeBegin._4_4_ = -1;
  }
  else {
    forward = jh_buffer;
    while (*forward != '\0') {
      pcVar2 = jh_get_lexeme(forward,(int *)&lexemeBegin);
      if (pcVar2 == forward) {
        return -2;
      }
      jh_tackle(forward,(int)pcVar2 - (int)forward,(int)lexemeBegin);
      forward = pcVar2;
    }
    lexemeBegin._4_4_ = 0;
  }
  return lexemeBegin._4_4_;
}

Assistant:

int jh_lex() {
    int type = -1;
    if (!fread(jh_buffer, 1, jh_buffer_sz, jh_in))
        return -1;
    char *lexemeBegin = jh_buffer;
    char *forward;

    while (*lexemeBegin != '\0') {
        forward = jh_get_lexeme(lexemeBegin, &type);
        if (forward == lexemeBegin) return -2;
        jh_tackle(lexemeBegin, (int)(forward - lexemeBegin), type);
        lexemeBegin = forward;
    }
    return 0;
}